

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_ppm_file_intern(ConstPtr *image,string *filename)

{
  ushort uVar1;
  element_type *peVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  FileException *this;
  int *piVar5;
  char *msg;
  invalid_argument *piVar6;
  int i;
  long lVar7;
  int iVar8;
  undefined1 local_260 [8];
  ofstream out;
  int aiStack_240 [120];
  size_type *local_60;
  string magic_number;
  ConstPtr handle;
  ValueType value;
  
  peVar2 = (image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Null image given");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_60 = &magic_number._M_string_length;
  magic_number._M_dataplus._M_p = (pointer)0x0;
  magic_number._M_string_length._0_1_ = 0;
  iVar3 = peVar2->c;
  if ((iVar3 != 3) && (iVar3 != 1)) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Supports 1 and 3 channel images only");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::assign((char *)&local_60);
  iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->_vptr_ImageBase[6])();
  iVar8 = 0xff;
  if (iVar3 != 1) {
    iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->_vptr_ImageBase[6])();
    iVar8 = 0xffff;
    if (iVar3 != 2) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Invalid image format");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  std::ofstream::ofstream(local_260,(filename->_M_dataplus)._M_p,_S_bin);
  if (*(int *)((long)aiStack_240 + (long)*(_func_int **)((long)local_260 + -0x18)) != 0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar5 = __errno_location();
    msg = strerror(*piVar5);
    util::FileException::FileException(this,filename,msg);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  poVar4 = std::operator<<((ostream *)local_260,(string *)&local_60);
  std::operator<<(poVar4,anon_var_dwarf_9b90f + 10);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (local_260,
                      ((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->w);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,((image->
                              super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_ptr)->h);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
  std::operator<<(poVar4,anon_var_dwarf_9b90f + 10);
  iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->_vptr_ImageBase[6])();
  if (iVar3 == 1) {
    iVar3 = (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->_vptr_ImageBase[4])();
    (*((image->super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_ImageBase[3])();
    std::ostream::write(local_260,CONCAT44(extraout_var,iVar3));
  }
  else {
    std::dynamic_pointer_cast<core::Image<unsigned_short>const,core::ImageBase_const>
              ((shared_ptr<const_core::ImageBase> *)((long)&magic_number.field_2 + 8));
    for (lVar7 = 0;
        lVar7 < (int)((ulong)(*(long *)(magic_number.field_2._8_8_ + 0x20) -
                             *(long *)(magic_number.field_2._8_8_ + 0x18)) >> 1); lVar7 = lVar7 + 1)
    {
      uVar1 = *(ushort *)(*(long *)(magic_number.field_2._8_8_ + 0x18) + lVar7 * 2);
      handle.super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._6_2_ = uVar1 << 8 | uVar1 >> 8;
      std::ostream::write(local_260,
                          (long)((long)&handle.
                                        super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi + 6));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&handle);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_260);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void
save_ppm_file_intern (ImageBase::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    std::string magic_number;
    if (image->channels() == 1)
        magic_number = "P5";
    else if (image->channels() == 3)
        magic_number = "P6";
    else
        throw std::invalid_argument("Supports 1 and 3 channel images only");

    int maxval = 0;
    if (image->get_type() == IMAGE_TYPE_UINT8)
        maxval = 255;
    else if (image->get_type() == IMAGE_TYPE_UINT16)
        maxval = 65535;
    else
        throw std::invalid_argument("Invalid image format");

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out << magic_number << "\n";
    out << image->width() << " " << image->height() << " " << maxval << "\n";

    if (image->get_type() == IMAGE_TYPE_UINT8)
    {
        /* Byte images can be saved as-is. */
        out.write(image->get_byte_pointer(), image->get_byte_size());
    }
    else
    {
        /* PPM is big-endian, so we need to convert 16 bit data. */
        RawImage::ConstPtr handle
            = std::dynamic_pointer_cast<RawImage const>(image);
        for (int i = 0; i < handle->get_value_amount(); ++i)
        {
            RawImage::ValueType value = util::system::betoh(handle->at(i));
            out.write((char const*)(&value), sizeof(RawImage::ValueType));
        }
    }
    out.close();
}